

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSwap.cpp
# Opt level: O0

void __thiscall NaPNSwapper::NaPNSwapper(NaPNSwapper *this,char *szNodeName)

{
  NaPetriCnInput *in_RDI;
  char *in_stack_000003e8;
  NaPetriNode *in_stack_000003f0;
  char *in_stack_ffffffffffffffc0;
  NaPetriNode *in_stack_ffffffffffffffc8;
  NaPetriNode *pHost;
  NaPetriNode *pHost_00;
  NaPetriCnOutput *in_stack_ffffffffffffffe0;
  
  NaPetriNode::NaPetriNode(in_stack_000003f0,in_stack_000003e8);
  (in_RDI->super_NaPetriConnector)._vptr_NaPetriConnector = (_func_int **)&PTR__NaPNSwapper_00195ae0
  ;
  pHost_00 = (NaPetriNode *)(in_RDI + 1);
  NaPetriCnInput::NaPetriCnInput(in_RDI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pHost = (NaPetriNode *)(in_RDI + 2);
  NaPetriCnInput::NaPetriCnInput(in_RDI,pHost,in_stack_ffffffffffffffc0);
  NaPetriCnInput::NaPetriCnInput(in_RDI,pHost,(char *)(in_RDI + 3));
  NaPetriCnOutput::NaPetriCnOutput(in_stack_ffffffffffffffe0,pHost_00,(char *)in_RDI);
  NaPetriCnOutput::NaPetriCnOutput(in_stack_ffffffffffffffe0,pHost_00,(char *)in_RDI);
  return;
}

Assistant:

NaPNSwapper::NaPNSwapper (const char* szNodeName)
: NaPetriNode(szNodeName),
  ////////////////
  // Connectors //
  ////////////////
  in(this, "in"),
  in2(this, "in2"),
  out(this, "out"),
  out2(this, "out2"),
  turn(this, "turn")
{
    // Nothing to do
}